

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::deviceMemoryProperties
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  ostringstream *this;
  uint uVar2;
  TestLog *pTVar3;
  bool bVar4;
  InstanceInterface *pIVar5;
  VkPhysicalDevice pVVar6;
  uint *puVar7;
  long lVar8;
  deUint8 buffer [552];
  VkMemoryPropertyFlags validPropertyFlags [9];
  undefined1 local_5a0 [16];
  TestLog local_590 [13];
  ios_base local_528 [264];
  Bitfield<32UL> local_420;
  Bitfield<32UL> local_408;
  VkPhysicalDeviceMemoryProperties local_3e8;
  char acStack_1e0 [40];
  undefined1 local_1b8 [392];
  
  pTVar3 = context->m_testCtx->m_log;
  memset(&local_3e8,0xcd,0x228);
  pIVar5 = Context::getInstanceInterface(context);
  pVVar6 = Context::getPhysicalDevice(context);
  (*pIVar5->_vptr_InstanceInterface[7])(pIVar5,pVVar6,&local_3e8);
  this = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"device = ",9);
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(this);
  local_5a0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar1 = (ostringstream *)(local_5a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  ::vk::operator<<((ostream *)poVar1,&local_3e8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_528);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  lVar8 = 0;
  do {
    if (acStack_1e0[lVar8] != -0x33) {
      poVar1 = (ostringstream *)(local_5a0 + 8);
      local_5a0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"deviceMemoryProperties - Guard offset ",0x26);
      std::ostream::operator<<(poVar1,(int)lVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," not valid",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_528);
      local_5a0._0_8_ = local_590;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5a0,"deviceMemoryProperties buffer overflow","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                 (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
      goto LAB_0041860c;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  if (local_3e8.memoryHeapCount < 0x10) {
    if ((local_3e8.memoryHeapCount == 1) && (((byte)local_3e8.memoryHeaps[0].flags & 1) == 0)) {
      poVar1 = (ostringstream *)(local_5a0 + 8);
      local_5a0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"deviceMemoryProperties - Single heap is not marked DEVICE_LOCAL"
                 ,0x3f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_528);
      local_5a0._0_8_ = local_590;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5a0,"deviceMemoryProperties invalid HeapFlags","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                 (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
    }
    else {
      local_1b8._16_8_ = 0x60000000f;
      local_1b8._24_8_ = 0xe0000000a;
      local_1b8._0_8_ = (TestLog *)0x100000000;
      local_1b8._8_8_ = 0xb00000007;
      local_1b8._32_4_ = 0x11;
      if (local_3e8.memoryTypeCount != 0) {
        lVar8 = 0;
        bVar4 = false;
        do {
          if (local_3e8.memoryHeapCount <= local_3e8.memoryTypes[lVar8].heapIndex) {
            poVar1 = (ostringstream *)(local_5a0 + 8);
            local_5a0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"deviceMemoryProperties - heapIndex ",0x23);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," larger than heapCount",0x16);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_528);
            local_5a0._0_8_ = local_590;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a0,"deviceMemoryProperties - invalid heapIndex","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                       (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
            goto LAB_0041860c;
          }
          uVar2 = local_3e8.memoryTypes[lVar8].propertyFlags;
          if ((~uVar2 & 6) == 0) {
            bVar4 = true;
          }
          local_5a0._0_8_ = CONCAT44(local_5a0._4_4_,uVar2) & 0xffffffff0000001f;
          puVar7 = std::
                   __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                             (local_1b8,local_1b8 + 0x24,local_5a0);
          if (puVar7 == (uint *)(local_1b8 + 0x24)) {
            poVar1 = (ostringstream *)(local_5a0 + 8);
            local_5a0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"deviceMemoryProperties - propertyFlags ",0x27);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," not valid",10);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_528);
            local_5a0._0_8_ = local_590;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a0,"deviceMemoryProperties propertyFlags not valid","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                       (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
            goto LAB_0041860c;
          }
          uVar2 = local_3e8.memoryHeaps[local_3e8.memoryTypes[lVar8].heapIndex].flags;
          if ((local_3e8.memoryTypes[lVar8].propertyFlags & 1) == 0) {
            if ((uVar2 & 1) != 0) {
              poVar1 = (ostringstream *)(local_5a0 + 8);
              local_5a0._0_8_ = pTVar3;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "deviceMemoryProperties - non-DEVICE_LOCAL memory type references heap with is DEVICE_LOCAL"
                         ,0x5a);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_528);
              local_5a0._0_8_ = local_590;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5a0,
                         "deviceMemoryProperties inconsistent memoryType and HeapFlags","");
              __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
              (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                         (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
              goto LAB_0041860c;
            }
          }
          else if ((uVar2 & 1) == 0) {
            poVar1 = (ostringstream *)(local_5a0 + 8);
            local_5a0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "deviceMemoryProperties - DEVICE_LOCAL memory type references heap which is not DEVICE_LOCAL"
                       ,0x5b);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_528);
            local_5a0._0_8_ = local_590;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a0,
                       "deviceMemoryProperties inconsistent memoryType and HeapFlags","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                       (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
            goto LAB_0041860c;
          }
          lVar8 = lVar8 + 1;
        } while ((uint)lVar8 < local_3e8.memoryTypeCount);
        if (bVar4) {
          local_5a0._0_8_ = local_590;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a0,"Querying memory properties succeeded","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                     (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
          goto LAB_0041860c;
        }
      }
      poVar1 = (ostringstream *)(local_5a0 + 8);
      local_5a0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"deviceMemoryProperties - required property flags ",0x31);
      ::vk::getMemoryPropertyFlagsStr(&local_420,6);
      local_408.m_end = local_420.m_end;
      local_408.m_value = local_420.m_value;
      local_408.m_begin = local_420.m_begin;
      tcu::Format::Bitfield<32UL>::toStream(&local_408,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," not found",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_528);
      local_5a0._0_8_ = local_590;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5a0,"deviceMemoryProperties propertyFlags not valid","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
                 (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
    }
  }
  else {
    poVar1 = (ostringstream *)(local_5a0 + 8);
    local_5a0._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"deviceMemoryProperties - HeapCount larger than ",0x2f);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_528);
    local_5a0._0_8_ = local_590;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5a0,"deviceMemoryProperties HeapCount too large","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_5a0._0_8_,
               (long)(qpTestLog **)local_5a0._0_8_ + local_5a0._8_8_);
  }
LAB_0041860c:
  if ((TestLog *)local_5a0._0_8_ != local_590) {
    operator_delete((void *)local_5a0._0_8_,(ulong)((long)&(local_590[0].m_log)->flags + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceMemoryProperties (Context& context)
{
	TestLog&							log			= context.getTestContext().getLog();
	VkPhysicalDeviceMemoryProperties*	memProps;
	deUint8								buffer[sizeof(VkPhysicalDeviceMemoryProperties) + GUARD_SIZE];

	memProps = reinterpret_cast<VkPhysicalDeviceMemoryProperties*>(buffer);
	deMemset(buffer, GUARD_VALUE, sizeof(buffer));

	context.getInstanceInterface().getPhysicalDeviceMemoryProperties(context.getPhysicalDevice(), memProps);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *memProps << TestLog::EndMessage;

	for (deInt32 ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceMemoryProperties)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceMemoryProperties - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties buffer overflow");
		}
	}

	if (memProps->memoryHeapCount >= VK_MAX_MEMORY_HEAPS)
	{
		log << TestLog::Message << "deviceMemoryProperties - HeapCount larger than " << (deUint32)VK_MAX_MEMORY_HEAPS << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceMemoryProperties HeapCount too large");
	}

	if (memProps->memoryHeapCount == 1)
	{
		if ((memProps->memoryHeaps[0].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) == 0)
		{
			log << TestLog::Message << "deviceMemoryProperties - Single heap is not marked DEVICE_LOCAL" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties invalid HeapFlags");
		}
	}

	const VkMemoryPropertyFlags validPropertyFlags[] =
	{
		0,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT
	};

	const VkMemoryPropertyFlags requiredPropertyFlags[] =
	{
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
	};

	bool requiredFlagsFound[DE_LENGTH_OF_ARRAY(requiredPropertyFlags)];
	std::fill(DE_ARRAY_BEGIN(requiredFlagsFound), DE_ARRAY_END(requiredFlagsFound), false);

	for (deUint32 memoryNdx = 0; memoryNdx < memProps->memoryTypeCount; memoryNdx++)
	{
		bool validPropTypeFound = false;

		if (memProps->memoryTypes[memoryNdx].heapIndex >= memProps->memoryHeapCount)
		{
			log << TestLog::Message << "deviceMemoryProperties - heapIndex " << memProps->memoryTypes[memoryNdx].heapIndex << " larger than heapCount" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties - invalid heapIndex");
		}

		const VkMemoryPropertyFlags bitsToCheck = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;

		for (const VkMemoryPropertyFlags* requiredFlagsIterator = DE_ARRAY_BEGIN(requiredPropertyFlags); requiredFlagsIterator != DE_ARRAY_END(requiredPropertyFlags); requiredFlagsIterator++)
			if ((memProps->memoryTypes[memoryNdx].propertyFlags & *requiredFlagsIterator) == *requiredFlagsIterator)
				requiredFlagsFound[requiredFlagsIterator - DE_ARRAY_BEGIN(requiredPropertyFlags)] = true;

		if (de::contains(DE_ARRAY_BEGIN(validPropertyFlags), DE_ARRAY_END(validPropertyFlags), memProps->memoryTypes[memoryNdx].propertyFlags & bitsToCheck))
			validPropTypeFound = true;

		if (!validPropTypeFound)
		{
			log << TestLog::Message << "deviceMemoryProperties - propertyFlags "
				<< memProps->memoryTypes[memoryNdx].propertyFlags << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties propertyFlags not valid");
		}

		if (memProps->memoryTypes[memoryNdx].propertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
		{
			if ((memProps->memoryHeaps[memProps->memoryTypes[memoryNdx].heapIndex].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) == 0)
			{
				log << TestLog::Message << "deviceMemoryProperties - DEVICE_LOCAL memory type references heap which is not DEVICE_LOCAL" << TestLog::EndMessage;
				return tcu::TestStatus::fail("deviceMemoryProperties inconsistent memoryType and HeapFlags");
			}
		}
		else
		{
			if (memProps->memoryHeaps[memProps->memoryTypes[memoryNdx].heapIndex].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT)
			{
				log << TestLog::Message << "deviceMemoryProperties - non-DEVICE_LOCAL memory type references heap with is DEVICE_LOCAL" << TestLog::EndMessage;
				return tcu::TestStatus::fail("deviceMemoryProperties inconsistent memoryType and HeapFlags");
			}
		}
	}

	bool* requiredFlagsFoundIterator = std::find(DE_ARRAY_BEGIN(requiredFlagsFound), DE_ARRAY_END(requiredFlagsFound), false);
	if (requiredFlagsFoundIterator != DE_ARRAY_END(requiredFlagsFound))
	{
		DE_ASSERT(requiredFlagsFoundIterator - DE_ARRAY_BEGIN(requiredFlagsFound) <= DE_LENGTH_OF_ARRAY(requiredPropertyFlags));
		log << TestLog::Message << "deviceMemoryProperties - required property flags "
			<< getMemoryPropertyFlagsStr(requiredPropertyFlags[requiredFlagsFoundIterator - DE_ARRAY_BEGIN(requiredFlagsFound)]) << " not found" << TestLog::EndMessage;

		return tcu::TestStatus::fail("deviceMemoryProperties propertyFlags not valid");
	}

	return tcu::TestStatus::pass("Querying memory properties succeeded");
}